

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.hpp
# Opt level: O3

void __thiscall
gl4cts::EnhancedLayouts::Utils::Shader::InvalidSourceException::~InvalidSourceException
          (InvalidSourceException *this)

{
  ~InvalidSourceException(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

virtual ~InvalidSourceException() throw()
		{
		}